

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanContextTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::SpanContext_testFromStream_Test::TestBody(SpanContext_testFromStream_Test *this)

{
  FromStreamTestCase *this_00;
  char *pcVar1;
  long lVar2;
  allocator local_678;
  undefined7 uStack_677;
  allocator local_670 [13];
  allocator local_663;
  allocator local_662;
  allocator local_661;
  allocator local_660;
  allocator local_65f;
  allocator local_65e;
  allocator local_65d;
  allocator local_65c;
  allocator local_65b;
  allocator local_65a;
  allocator local_659;
  mutex *local_658;
  SpanContext spanContext;
  SpanContext spanContextFromStreamOp;
  stringstream ss;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4e8;
  ostream local_4e0 [376];
  FromStreamTestCase testCases [16];
  SpanContext local_e0;
  
  this_00 = testCases;
  std::__cxx11::string::string((string *)this_00,"",(allocator *)&ss);
  testCases[0]._success = false;
  std::__cxx11::string::string((string *)(testCases + 1),"abcd",(allocator *)&spanContext);
  testCases[1]._success = false;
  std::__cxx11::string::string
            ((string *)(testCases + 2),"ABCD",(allocator *)&spanContextFromStreamOp);
  testCases[2]._success = false;
  std::__cxx11::string::string((string *)(testCases + 3),"x:1:1:1",&local_678);
  testCases[3]._success = false;
  std::__cxx11::string::string((string *)(testCases + 4),"1:x:1:1",local_670);
  testCases[4]._success = false;
  std::__cxx11::string::string((string *)(testCases + 5),"1:1:x:1",&local_659);
  testCases[5]._success = false;
  std::__cxx11::string::string((string *)(testCases + 6),"1:1:1:x",&local_65a);
  testCases[6]._success = false;
  std::__cxx11::string::string
            ((string *)(testCases + 7),"01234567890123456789012345678901234:1:1:1",&local_65b);
  testCases[7]._success = false;
  std::__cxx11::string::string
            ((string *)(testCases + 8),"01234567890123456789012345678901:1:1:1",&local_65c);
  testCases[8]._success = true;
  std::__cxx11::string::string
            ((string *)(testCases + 9),"01234_67890123456789012345678901:1:1:1",&local_65d);
  testCases[9]._success = false;
  std::__cxx11::string::string
            ((string *)(testCases + 10),"0123456789012345678901_345678901:1:1:1",&local_65e);
  testCases[10]._success = false;
  std::__cxx11::string::string((string *)(testCases + 0xb),"1:0123456789012345:1:1",&local_65f);
  testCases[0xb]._success = true;
  std::__cxx11::string::string((string *)(testCases + 0xc),"1:01234567890123456:1:1",&local_660);
  testCases[0xc]._success = false;
  std::__cxx11::string::string((string *)(testCases + 0xd),"10000000000000001:1:1:1",&local_661);
  testCases[0xd]._success = true;
  std::__cxx11::string::string((string *)(testCases + 0xe),"10000000000000001:1:1",&local_662);
  testCases[0xe]._success = false;
  std::__cxx11::string::string((string *)(testCases + 0xf),"1:1:1:1",&local_663);
  testCases[0xf]._success = true;
  local_658 = &spanContext._mutex;
  lVar2 = 0x280;
  do {
    if (lVar2 == 0) {
LAB_001a1431:
      lVar2 = 600;
      do {
        std::__cxx11::string::~string
                  ((string *)((long)&testCases[0]._input._M_dataplus._M_p + lVar2));
        lVar2 = lVar2 + -0x28;
      } while (lVar2 != -0x28);
      return;
    }
    spanContext.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_0021e2e8;
    spanContext._flags = '\0';
    spanContext._spanID = 0;
    spanContext._parentID = 0;
    spanContext._traceID._high = 0;
    spanContext._traceID._low = 0;
    spanContext._baggage._M_h._M_buckets = &spanContext._baggage._M_h._M_single_bucket;
    spanContext._baggage._M_h._M_bucket_count = 1;
    spanContext._baggage._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    spanContext._baggage._M_h._M_element_count = 0;
    spanContext._baggage._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    spanContext._baggage._M_h._M_rehash_policy._M_next_resize = 0;
    spanContext._baggage._M_h._M_single_bucket = (__node_base_ptr)0x0;
    spanContext._debugID._M_dataplus._M_p = (pointer)&spanContext._debugID.field_2;
    spanContext._debugID._M_string_length = 0;
    spanContext._debugID.field_2._M_local_buf[0] = '\0';
    *(undefined8 *)((long)&(local_658->super___mutex_base)._M_mutex + 0x10) = 0;
    (local_658->super___mutex_base)._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
    (local_658->super___mutex_base)._M_mutex.__align = 0;
    *(undefined8 *)((long)&(local_658->super___mutex_base)._M_mutex + 8) = 0;
    (local_658->super___mutex_base)._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::operator<<(local_4e0,(string *)this_00);
    jaegertracing::SpanContext::fromStream((istream *)&local_e0);
    SpanContext::swap(&spanContext,&local_e0);
    SpanContext::~SpanContext(&local_e0);
    local_678 = (allocator)
                (spanContext._spanID != 0 &&
                (spanContext._traceID._low != 0 || spanContext._traceID._high != 0));
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&spanContextFromStreamOp,"testCase._success","spanContext.isValid()",
               &this_00->_success,(bool *)&local_678);
    if ((char)spanContextFromStreamOp.super_SpanContext._vptr_SpanContext == '\0') {
      testing::Message::Message((Message *)&local_678);
      std::operator<<((ostream *)(CONCAT71(uStack_677,local_678) + 0x10),"input=");
      pcVar1 = "";
      std::operator<<((ostream *)(CONCAT71(uStack_677,local_678) + 0x10),(string *)this_00);
      if (spanContextFromStreamOp._traceID._high != 0) {
        pcVar1 = *(char **)spanContextFromStreamOp._traceID._high;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_670,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/SpanContextTest.cpp"
                 ,0x3d,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_670,(Message *)&local_678);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_670);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_678);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&spanContextFromStreamOp._traceID);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
LAB_001a1427:
      SpanContext::~SpanContext(&spanContext);
      goto LAB_001a1431;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&spanContextFromStreamOp._traceID);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    spanContextFromStreamOp.super_SpanContext._vptr_SpanContext =
         (_func_int **)&PTR__SpanContext_0021e2e8;
    spanContextFromStreamOp._flags = '\0';
    spanContextFromStreamOp._spanID = 0;
    spanContextFromStreamOp._parentID = 0;
    spanContextFromStreamOp._traceID._high = 0;
    spanContextFromStreamOp._traceID._low = 0;
    spanContextFromStreamOp._baggage._M_h._M_buckets =
         &spanContextFromStreamOp._baggage._M_h._M_single_bucket;
    spanContextFromStreamOp._baggage._M_h._M_bucket_count = 1;
    spanContextFromStreamOp._baggage._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    spanContextFromStreamOp._baggage._M_h._M_element_count = 0;
    spanContextFromStreamOp._baggage._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    spanContextFromStreamOp._baggage._M_h._M_rehash_policy._M_next_resize = 0;
    spanContextFromStreamOp._baggage._M_h._M_single_bucket = (__node_base_ptr)0x0;
    spanContextFromStreamOp._debugID._M_dataplus._M_p =
         (pointer)&spanContextFromStreamOp._debugID.field_2;
    spanContextFromStreamOp._debugID._M_string_length = 0;
    spanContextFromStreamOp._debugID.field_2._M_local_buf[0] = '\0';
    spanContextFromStreamOp._mutex.super___mutex_base._M_mutex._16_8_ = 0;
    spanContextFromStreamOp._mutex.super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    spanContextFromStreamOp._mutex.super___mutex_base._M_mutex.__align = 0;
    spanContextFromStreamOp._mutex.super___mutex_base._M_mutex._8_8_ = 0;
    spanContextFromStreamOp._mutex.super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::operator<<(local_4e0,(string *)this_00);
    operator>>((istream *)&ss,&spanContextFromStreamOp);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    testing::internal::CmpHelperEQ<jaegertracing::SpanContext,jaegertracing::SpanContext>
              ((internal *)&ss,"spanContext","spanContextFromStreamOp",&spanContext,
               &spanContextFromStreamOp);
    if (ss == (stringstream)0x0) {
      testing::Message::Message((Message *)&local_678);
      if (local_4e8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((local_4e8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_670,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/SpanContextTest.cpp"
                 ,0x48,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_670,(Message *)&local_678);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_670);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_678);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&local_4e8);
      SpanContext::~SpanContext(&spanContextFromStreamOp);
      goto LAB_001a1427;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&local_4e8);
    SpanContext::~SpanContext(&spanContextFromStreamOp);
    SpanContext::~SpanContext(&spanContext);
    lVar2 = lVar2 + -0x28;
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

TEST(SpanContext, testFromStream)
{
    const FromStreamTestCase testCases[] = {
        { "", false },
        { "abcd", false },
        { "ABCD", false },
        { "x:1:1:1", false },
        { "1:x:1:1", false },
        { "1:1:x:1", false },
        { "1:1:1:x", false },
        { "01234567890123456789012345678901234:1:1:1", false },
        { "01234567890123456789012345678901:1:1:1", true },
        { "01234_67890123456789012345678901:1:1:1", false },
        { "0123456789012345678901_345678901:1:1:1", false },
        { "1:0123456789012345:1:1", true },
        { "1:01234567890123456:1:1", false },
        { "10000000000000001:1:1:1", true },
        { "10000000000000001:1:1", false },
        { "1:1:1:1", true }
    };

    for (auto&& testCase : testCases) {
        SpanContext spanContext;
        {
            std::stringstream ss;
            ss << testCase._input;
            spanContext = SpanContext::fromStream(ss);
            ASSERT_EQ(testCase._success, spanContext.isValid())
                << "input=" << testCase._input;
        }

        SpanContext spanContextFromStreamOp;
        {
            std::stringstream ss;
            ss << testCase._input;
            ss >> spanContextFromStreamOp;
        }

        ASSERT_EQ(spanContext, spanContextFromStreamOp);
    }
}